

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O3

CaseDefinition *
vkt::pipeline::anon_unknown_0::makeArrayCompositeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,DataType elemType,int size1,int size2)

{
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *__return_storage_ptr___00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DataType dataType;
  DataType DVar2;
  long *plVar3;
  undefined8 *puVar4;
  char *pcVar5;
  ostream *poVar6;
  size_t sVar7;
  CaseDefinition *extraout_RAX;
  CaseDefinition *pCVar8;
  undefined4 in_register_0000000c;
  size_type *psVar9;
  ulong *puVar10;
  pointer *ppSVar11;
  int specConstNdx;
  int iVar12;
  int idxBegin;
  ulong uVar13;
  undefined8 uVar14;
  pointer pSVar15;
  int iVar16;
  long lVar17;
  int idxEnd;
  int iVar18;
  DataType type;
  string caseName;
  string elemTypeName;
  string padding;
  string accumType;
  string arraySizeDecl;
  string varName;
  ostringstream arrayCtorExpr;
  ostringstream globalCode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  CaseDefinition *local_4d8;
  int local_4cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined8 local_4a8;
  string local_4a0;
  undefined1 local_480 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_468 [2];
  ostream *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  long *local_420;
  long local_418;
  long local_410;
  undefined8 uStack_408;
  pointer *local_400;
  long local_3f8;
  pointer local_3f0;
  long lStack_3e8;
  undefined1 local_3e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  pointer local_3b0 [2];
  pointer local_3a0;
  long local_398;
  _Alloc_hider local_390;
  _Alloc_hider _Stack_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  pointer local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ios_base local_138 [264];
  
  local_3e0._0_8_ = local_3e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,"a","",CONCAT44(in_register_0000000c,size2));
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::ostream::operator<<(local_320,3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,0xb58f90);
  local_480._0_8_ = local_480 + 0x10;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar9) {
    local_480._16_8_ = *psVar9;
    aaStack_468[0]._0_8_ = plVar3[3];
  }
  else {
    local_480._16_8_ = *psVar9;
    local_480._0_8_ = (size_type *)*plVar3;
  }
  local_480._8_8_ = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_4d8 = __return_storage_ptr__;
  plVar3 = (long *)std::__cxx11::string::append(local_480);
  puVar10 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar10) {
    local_198 = *puVar10;
    uStack_190 = (undefined4)plVar3[3];
    uStack_18c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_1a8 = &local_198;
  }
  else {
    local_198 = *puVar10;
    local_1a8 = (ulong *)*plVar3;
  }
  local_1a0 = plVar3[1];
  *plVar3 = (long)puVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (size1 < 1) {
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::ostream::operator<<(local_320,size1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,0xb58f90);
    local_3a0 = (pointer)&local_390;
    pSVar15 = (pointer)(plVar3 + 2);
    if ((pointer)*plVar3 == pSVar15) {
      local_390._M_p = *(pointer *)pSVar15;
      _Stack_388._M_p = (pointer)plVar3[3];
    }
    else {
      local_390._M_p = *(pointer *)pSVar15;
      local_3a0 = (pointer)*plVar3;
    }
    local_398 = plVar3[1];
    *plVar3 = (long)pSVar15;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_3a0);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    puVar10 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_4c8.field_2._M_allocated_capacity = *puVar10;
      local_4c8.field_2._8_8_ = plVar3[3];
    }
    else {
      local_4c8.field_2._M_allocated_capacity = *puVar10;
      local_4c8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_4c8._M_string_length = plVar3[1];
    *plVar3 = (long)puVar10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  uVar13 = 0xf;
  if (local_1a8 != &local_198) {
    uVar13 = local_198;
  }
  if (uVar13 < local_4c8._M_string_length + local_1a0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      uVar14 = local_4c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4c8._M_string_length + local_1a0) goto LAB_004c32d1;
    lVar17 = local_1a0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4c8,0,(char *)0x0,(ulong)local_1a8);
    iVar16 = (int)lVar17;
  }
  else {
LAB_004c32d1:
    lVar17 = local_1a0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_4c8._M_dataplus._M_p);
    iVar16 = (int)lVar17;
  }
  local_420 = &local_410;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_410 = *plVar3;
    uStack_408 = puVar4[3];
  }
  else {
    local_410 = *plVar3;
    local_420 = (long *)*puVar4;
  }
  local_418 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if (0 < size1) {
    if (local_3a0 != (pointer)&local_390) {
      operator_delete(local_3a0,(ulong)(local_390._M_p + 1));
    }
    if ((pointer *)local_340._M_allocated_capacity != local_330) {
      operator_delete((void *)local_340._M_allocated_capacity,(ulong)((long)&local_330[0]->size + 1)
                     );
    }
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
    operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  iVar12 = 3;
  if (0 < size1) {
    iVar12 = size1 * 3;
  }
  pcVar5 = glu::getDataTypeName(elemType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,pcVar5,(allocator<char> *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  local_4cc = iVar12;
  if (0 < iVar12) {
    specConstNdx = 0;
    local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(CONCAT44(local_4a8._4_4_,
                             (uint)(byte)((byte)(0x777ffbffd >> ((byte)elemType & 0x3f)) |
                                         TYPE_BOOL < elemType)) & 0xffffffff00000001);
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_4c8._M_dataplus._M_p,
                          local_4c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_3e0._0_8_,local_3e0._8_8_);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,specConstNdx);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_420,local_418);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_420,local_418);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"sc0","");
      std::__cxx11::ostringstream::ostringstream(local_320);
      if (size1 < 1) {
        iVar16 = 3;
        composite_case_internal::generateInitializerListWithSpecConstant
                  ((string *)local_480,elemType,SUB81(local_4a8,0),0,3,&local_4a0,specConstNdx);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)local_480._0_8_,local_480._8_8_);
        if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
          operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
        }
      }
      else {
        local_480._0_8_ = local_480 + 0x10;
        local_448 = poVar6;
        std::__cxx11::string::_M_construct((ulong)local_480,'$');
        iVar18 = 3;
        idxBegin = 0;
        do {
          if (iVar18 == 3) {
            local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
            local_4f8._M_string_length = 0;
            local_4f8.field_2._M_local_buf[0] = '\0';
          }
          else {
            std::operator+(&local_4f8,",\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_480);
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_320,local_4f8._M_dataplus._M_p,
                              local_4f8._M_string_length);
          pcVar5 = glu::getDataTypeName(elemType);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,size1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"](",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                                     local_4f8.field_2._M_local_buf[0]) + 1);
          }
          idxEnd = size1 + idxBegin;
          iVar16 = idxEnd;
          composite_case_internal::generateInitializerListWithSpecConstant
                    (&local_4f8,elemType,SUB81(local_4a8,0),idxBegin,idxEnd,&local_4a0,specConstNdx)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                                     local_4f8.field_2._M_local_buf[0]) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,")",1);
          iVar12 = local_4cc;
          iVar18 = iVar18 + -1;
          idxBegin = idxEnd;
        } while (iVar18 != 0);
        poVar6 = local_448;
        if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
          operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
          poVar6 = local_448;
        }
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_440._M_dataplus._M_p,local_440._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      specConstNdx = specConstNdx + 1;
    } while (specConstNdx != iVar12);
  }
  dataType = glu::getDataTypeScalarType(elemType);
  type = TYPE_DOUBLE_MAT2X3;
  if (dataType == TYPE_BOOL) {
    type = TYPE_INVALID;
  }
  pcVar5 = "";
  if (0 < size1) {
    pcVar5 = "array_";
  }
  std::operator+(&local_4f8,pcVar5,&local_4c8);
  DVar2 = TYPE_INT;
  if (dataType != TYPE_BOOL) {
    DVar2 = dataType;
  }
  pcVar5 = glu::getDataTypeName(DVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,pcVar5,(allocator<char> *)local_320);
  local_4a8 = &(local_4d8->name).field_2;
  (local_4d8->name)._M_dataplus._M_p = (pointer)local_4a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,local_4f8._M_dataplus._M_p,
             local_4f8._M_dataplus._M_p + local_4f8._M_string_length);
  local_380._M_allocated_capacity = (size_type)&local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"sc0","");
  composite_case_internal::makeSpecConstant
            ((SpecConstant *)local_480,(string *)&local_380,dataType,type,iVar16);
  __return_storage_ptr___00 = &local_4d8->specConstants;
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            (__return_storage_ptr___00,(SpecConstant *)local_480);
  local_448 = (ostream *)__return_storage_ptr___00;
  DVar2 = glu::getDataTypeScalarType(elemType);
  if (DVar2 < TYPE_BOOL_VEC2) {
    iVar16 = 4;
    if ((0x888000002U >> ((ulong)DVar2 & 0x3f) & 1) == 0) {
      if ((ulong)DVar2 != 0xe) goto LAB_004c3d7e;
      iVar16 = 8;
    }
  }
  else {
LAB_004c3d7e:
    iVar16 = 0;
  }
  local_4d8->ssboSize = (ulong)(uint)(iVar16 * iVar12);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_360,
                 "    ",&local_440);
  plVar3 = (long *)std::__cxx11::string::append(local_360._M_local_buf);
  ppSVar11 = (pointer *)(plVar3 + 2);
  if ((pointer *)*plVar3 == ppSVar11) {
    local_3f0 = *ppSVar11;
    lStack_3e8 = plVar3[3];
    local_400 = &local_3f0;
  }
  else {
    local_3f0 = *ppSVar11;
    local_400 = (pointer *)*plVar3;
  }
  local_3f8 = plVar3[1];
  *plVar3 = (long)ppSVar11;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::ostream::operator<<(local_320,local_4cc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  pSVar15 = (pointer)0xf;
  if (local_400 != &local_3f0) {
    pSVar15 = local_3f0;
  }
  if (pSVar15 < (pointer)(local_3c0._8_8_ + local_3f8)) {
    pSVar15 = (pointer)0xf;
    if ((pointer *)local_3c0._M_allocated_capacity != local_3b0) {
      pSVar15 = local_3b0[0];
    }
    if ((pointer)(local_3c0._8_8_ + local_3f8) <= pSVar15) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_400);
      goto LAB_004c3ad0;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_400,local_3c0._M_allocated_capacity);
LAB_004c3ad0:
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  psVar9 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_4a0.field_2._M_allocated_capacity = *psVar9;
    local_4a0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_4a0.field_2._M_allocated_capacity = *psVar9;
    local_4a0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_4a0._M_string_length = puVar4[1];
  *puVar4 = psVar9;
  puVar4[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  pCVar8 = local_4d8;
  paVar1 = &(local_4d8->ssboCode).field_2;
  (local_4d8->ssboCode)._M_dataplus._M_p = (pointer)paVar1;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar9) {
    lVar17 = plVar3[3];
    paVar1->_M_allocated_capacity = *psVar9;
    *(long *)((long)&(local_4d8->ssboCode).field_2 + 8) = lVar17;
  }
  else {
    (local_4d8->ssboCode)._M_dataplus._M_p = (pointer)*plVar3;
    (local_4d8->ssboCode).field_2._M_allocated_capacity = *psVar9;
  }
  (local_4d8->ssboCode)._M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::stringbuf::str();
  iVar16 = local_4cc;
  composite_case_internal::generateShaderChecksumComputationCode
            (&pCVar8->mainCode,elemType,(string *)local_3e0,&local_440,3,size1,local_4cc);
  composite_case_internal::computeExpectedValues(&pCVar8->expectedValues,type,dataType,iVar16);
  pCVar8->requirements = (uint)(dataType == TYPE_DOUBLE) << 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)local_3c0._M_allocated_capacity != local_3b0) {
    operator_delete((void *)local_3c0._M_allocated_capacity,(ulong)((long)&local_3b0[0]->specID + 1)
                   );
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,(ulong)((long)&local_3f0->specID + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_allocated_capacity != &local_350) {
    operator_delete((void *)local_360._M_allocated_capacity,local_350._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._8_8_ != aaStack_468) {
    operator_delete((void *)local_480._8_8_,aaStack_468[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_allocated_capacity != &local_370) {
    operator_delete((void *)local_380._M_allocated_capacity,local_370._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  pCVar8 = (CaseDefinition *)(local_3e0 + 0x10);
  if ((CaseDefinition *)local_3e0._0_8_ != pCVar8) {
    operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
    pCVar8 = extraout_RAX;
  }
  return pCVar8;
}

Assistant:

CaseDefinition makeArrayCompositeCaseDefinition (const glu::DataType elemType, const int size1, const int size2 = 0)
{
	using namespace composite_case_internal;

	DE_ASSERT(size1 > 0);

	const bool        isArrayOfArray  = (size2 > 0);
	const std::string varName		  = "a";
	const std::string arraySizeDecl   = "[" + de::toString(size1) + "]" + (isArrayOfArray ? "[" + de::toString(size2) + "]" : "");
	const int         numCombinations = (isArrayOfArray ? size1 * size2 : size1);
	const std::string elemTypeName    (glu::getDataTypeName(elemType));

	std::ostringstream globalCode;
	{
		// Create several arrays with specialization constant inserted in different positions.
		for (int combNdx = 0; combNdx < numCombinations; ++combNdx)
			globalCode << elemTypeName << " " << varName << combNdx << arraySizeDecl << " = "
					   << elemTypeName << arraySizeDecl << "(" << generateArrayConstructorString(elemType, size1, size2, "sc0", combNdx) << ");\n";
	}

	const glu::DataType scalarType = glu::getDataTypeScalarType(elemType);
	const bool          isBoolData = (scalarType == glu::TYPE_BOOL);
	const int           specValue  = (isBoolData ? 0 : 19);
	const std::string   caseName   = (isArrayOfArray ? "array_" : "") + elemTypeName;
	const std::string   accumType  = (glu::getDataTypeName(isBoolData ? glu::TYPE_INT : scalarType));

	const CaseDefinition def =
	{
		caseName,
		makeVector(makeSpecConstant("sc0", 1u, scalarType, specValue)),
		static_cast<VkDeviceSize>(getDataTypeScalarSizeBytes(elemType) * numCombinations),
		"    " + accumType + " result[" + de::toString(numCombinations) + "];\n",
		globalCode.str(),
		generateShaderChecksumComputationCode(elemType, varName, accumType, size1, size2, numCombinations),
		computeExpectedValues(specValue, scalarType, numCombinations),
		(scalarType == glu::TYPE_DOUBLE ? (FeatureFlags)FEATURE_SHADER_FLOAT_64 : (FeatureFlags)0),
	};
	return def;
}